

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::PluralFormat::toPattern(PluralFormat *this,UnicodeString *appendTo)

{
  if ((this->msgPattern).partsLength == 0) {
    UnicodeString::setToBogus(appendTo);
  }
  else {
    UnicodeString::append(appendTo,&(this->msgPattern).msg);
  }
  return appendTo;
}

Assistant:

UnicodeString&
PluralFormat::toPattern(UnicodeString& appendTo) {
    if (0 == msgPattern.countParts()) {
        appendTo.setToBogus();
    } else {
        appendTo.append(msgPattern.getPatternString());
    }
    return appendTo;
}